

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O3

void fill_cache(cacheblock_t *cache,size_t N,size_t depth)

{
  ulong uVar1;
  size_t sVar2;
  cacheblock_t *pcVar3;
  
  if (N != 0) {
    sVar2 = 0;
    pcVar3 = cache;
    do {
      uVar1 = 0;
      do {
        if (cache[sVar2].ptr[uVar1 + depth] == '\0') {
          if (uVar1 < 4) {
            memset(pcVar3->bytes + uVar1,0,4 - uVar1);
          }
          break;
        }
        pcVar3->bytes[uVar1] = cache[sVar2].ptr[uVar1 + depth];
        uVar1 = uVar1 + 1;
      } while (uVar1 != 4);
      sVar2 = sVar2 + 1;
      pcVar3 = pcVar3 + 1;
    } while (sVar2 != N);
  }
  return;
}

Assistant:

static void
fill_cache(cacheblock_t* cache, size_t N, size_t depth)
{
	for (size_t i=0; i < N; ++i) {
		unsigned int j=0;
		while (j < CACHED_BYTES && cache[i].ptr[depth+j]) {
			cache[i].bytes[j] = cache[i].ptr[depth+j];
			++j;
		}
		while (j < CACHED_BYTES) {
			cache[i].bytes[j] = 0;
			++j;
		}
	}
}